

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * GetCandidates(string *__return_storage_ptr__,TSpellCorrector *corrector,string *text)

{
  wstring *text_00;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__rhs;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar1;
  pointer pTVar2;
  wchar_t *pwVar3;
  undefined1 auVar4 [8];
  __type_conflict _Var5;
  wint_t wVar6;
  TLangModel *this_00;
  reference pvVar7;
  ulong uVar8;
  TWords *sentence;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong position;
  initializer_list_t init;
  initializer_list_t init_00;
  undefined1 local_1a0 [8];
  string candidateStr;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_170;
  undefined1 local_160 [8];
  wstring input;
  wstring firstCandidate;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_100;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_f0;
  undefined1 local_e0 [8];
  TSentences sentences;
  wstring wCurrWord;
  json currentResult;
  TWord currWord;
  undefined1 local_60 [8];
  TWords candidates;
  json results;
  
  NJamSpell::UTF8ToWide((wstring *)local_160,text);
  auVar4 = local_160;
  for (lVar10 = 0; (long)input._M_dataplus._M_p << 2 != lVar10; lVar10 = lVar10 + 4) {
    wVar6 = towlower(*(wint_t *)((long)auVar4 + lVar10));
    *(wint_t *)((long)auVar4 + lVar10) = wVar6;
  }
  this_00 = NJamSpell::TSpellCorrector::GetLangModel(corrector);
  NJamSpell::TLangModel::Tokenize((TSentences *)local_e0,this_00,(wstring *)local_160);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)&candidates.
                   super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
  init._M_len = 0;
  init._M_array = (iterator)&local_100;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::array(init);
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&candidates.
                          super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,"results");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(pvVar7,&local_100);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_100);
  uVar8 = 0;
  text_00 = (wstring *)((long)&firstCandidate.field_2 + 8);
  while( true ) {
    if ((ulong)(((long)sentences.
                       super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)local_e0) / 0x18) <= uVar8)
    break;
    sentence = (TWords *)((long)local_e0 + uVar8 * 0x18);
    position = 0;
    while( true ) {
      pTVar2 = (sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(sentence->
                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4) <= position)
      break;
      pTVar2 = pTVar2 + position;
      pwVar3 = pTVar2->Ptr;
      currWord.Ptr._0_4_ = (undefined4)pTVar2->Len;
      currWord.Ptr._4_4_ = *(undefined4 *)((long)&pTVar2->Len + 4);
      sentences.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&wCurrWord._M_string_length;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)
                 &sentences.
                  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar2->Ptr,
                 pTVar2->Ptr + pTVar2->Len);
      NJamSpell::TSpellCorrector::GetCandidatesRaw((TWords *)local_60,corrector,sentence,position);
      if (local_60 !=
          (undefined1  [8])
          candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
          .super__Vector_impl_data._M_start) {
        input.field_2._8_8_ = &firstCandidate._M_string_length;
        __rhs = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                ((long)&input.field_2 + 8);
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)__rhs,*(wchar_t **)local_60,
                   *(wchar_t **)local_60 + *(size_t *)((long)local_60 + 8));
        _Var5 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)&sentences.
                                    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__rhs);
        if (!_Var5) {
          pbVar1 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)(&wCurrWord.field_2._M_allocated_capacity + 1);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json(pbVar1,(nullptr_t)0x0);
          local_1a0 = (undefined1  [8])((long)pwVar3 - (long)local_160 >> 2);
          this = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)((long)&candidateStr.field_2 + 8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json<long,_long,_0>(this,(long *)local_1a0);
          pvVar7 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)pbVar1,"pos_from");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator=(pvVar7,this);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(this);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_170,(unsigned_long *)&currWord);
          pvVar7 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)pbVar1,"len");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator=(pvVar7,&local_170);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_170);
          init_00._M_len = 0;
          init_00._M_array = (iterator)&local_f0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::array(init_00);
          pvVar7 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)pbVar1,"candidates");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator=(pvVar7,&local_f0);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_f0);
          uVar9 = (long)candidates.
                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                        _M_impl.super__Vector_impl_data._M_start - (long)local_60 >> 4;
          if (6 < uVar9) {
            uVar9 = 7;
          }
          for (uVar11 = 0; (uint)((int)uVar9 << 4) != uVar11; uVar11 = uVar11 + 0x10) {
            lVar10 = *(long *)((long)(wchar_t **)local_60 + uVar11);
            firstCandidate.field_2._8_8_ = &stack0xfffffffffffffef0;
            std::__cxx11::wstring::_M_construct<wchar_t_const*>
                      ((wstring *)text_00,lVar10,
                       lVar10 + *(long *)((long)((long)local_60 + 8) + uVar11) * 4);
            NJamSpell::WideToUTF8((string *)local_1a0,text_00);
            std::__cxx11::wstring::~wstring((wstring *)text_00);
            pvVar7 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)((long)&wCurrWord.field_2 + 8),"candidates");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)text_00,(string *)local_1a0);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::push_back(pvVar7,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)text_00);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)text_00);
            std::__cxx11::string::~string((string *)local_1a0);
          }
          pvVar7 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)&candidates.
                                  super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"results");
          pbVar1 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)((long)&wCurrWord.field_2 + 8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::push_back(pvVar7,pbVar1);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(pbVar1);
        }
        std::__cxx11::wstring::~wstring((wstring *)((long)&input.field_2 + 8));
      }
      std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_60);
      std::__cxx11::wstring::~wstring
                ((wstring *)
                 &sentences.
                  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      position = position + 1;
    }
    uVar8 = uVar8 + 1;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(__return_storage_ptr__,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)&candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,4,' ',false);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&candidates.
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)local_e0);
  std::__cxx11::wstring::~wstring((wstring *)local_160);
  return __return_storage_ptr__;
}

Assistant:

std::string GetCandidates(const NJamSpell::TSpellCorrector& corrector,
                          const std::string& text)
{
    std::wstring input = NJamSpell::UTF8ToWide(text);
    std::transform(input.begin(), input.end(), input.begin(), std::towlower);
    NJamSpell::TSentences sentences = corrector.GetLangModel().Tokenize(input);

    nlohmann::json results;
    results["results"] = nlohmann::json::array();

    for (size_t i = 0; i < sentences.size(); ++i) {
        const NJamSpell::TWords& sentence = sentences[i];
        for (size_t j = 0; j < sentence.size(); ++j) {
            NJamSpell::TWord currWord = sentence[j];
            std::wstring wCurrWord(currWord.Ptr, currWord.Len);
            NJamSpell::TWords candidates = corrector.GetCandidatesRaw(sentence, j);
            if (candidates.empty()) {
                continue;
            }
            std::wstring firstCandidate(candidates[0].Ptr, candidates[0].Len);
            if (wCurrWord == firstCandidate) {
                continue;
            }
            nlohmann::json currentResult;
            currentResult["pos_from"] = currWord.Ptr - &input[0];
            currentResult["len"] = currWord.Len;
            currentResult["candidates"] = nlohmann::json::array();

            size_t candidatesSize = std::min(candidates.size(), size_t(7));
            for (size_t k = 0; k < candidatesSize; ++k) {
                NJamSpell::TWord candidate = candidates[k];
                std::string candidateStr = NJamSpell::WideToUTF8(std::wstring(candidate.Ptr, candidate.Len));
                currentResult["candidates"].push_back(candidateStr);
            }

            results["results"].push_back(currentResult);
        }
    }

    return results.dump(4);
}